

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O1

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,LogicalType *params_2)

{
  pointer pcVar1;
  LogicalType LStack_78;
  undefined1 local_60 [24];
  string local_48;
  
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 0x18),pcVar1,pcVar1 + fmt_str->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_60,(LogicalType *)params);
  LogicalType::LogicalType(&LStack_78,params_1);
  Exception::ConstructMessage<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,(Exception *)this,(string *)(local_60 + 0x18),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             &LStack_78,params_2);
  LogicalType::~LogicalType(&LStack_78);
  LogicalType::~LogicalType((LogicalType *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}